

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O2

bool __thiscall HACD::HACD::Save(HACD *this,char *fileName,bool uniColor,long numCluster)

{
  char cVar1;
  int iVar2;
  size_t p;
  size_t sVar3;
  ofstream fout;
  Material mat;
  
  std::ofstream::ofstream(&fout,fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)&mat,"Error saving %s\n",fileName);
      (*this->m_callBack)((char *)&mat,0.0,0.0,(this->m_graph).m_nV);
    }
  }
  else {
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)&mat,"Saving %s\n",fileName);
      (*this->m_callBack)((char *)&mat,0.0,0.0,(this->m_graph).m_nV);
    }
    Material::Material(&mat);
    if (numCluster < 0) {
      for (sVar3 = 0; sVar3 != this->m_nClusters; sVar3 = sVar3 + 1) {
        if (!uniColor) {
          mat.m_diffuseColor.m_data[2] = 0.0;
          mat.m_diffuseColor.m_data[0] = 0.0;
          mat.m_diffuseColor.m_data[1] = 0.0;
          do {
            if ((mat.m_diffuseColor.m_data[0] != mat.m_diffuseColor.m_data[1]) ||
               (NAN(mat.m_diffuseColor.m_data[0]) || NAN(mat.m_diffuseColor.m_data[1]))) {
              if (((mat.m_diffuseColor.m_data[2] != mat.m_diffuseColor.m_data[1]) ||
                  (NAN(mat.m_diffuseColor.m_data[2]) || NAN(mat.m_diffuseColor.m_data[1]))) &&
                 ((mat.m_diffuseColor.m_data[2] != mat.m_diffuseColor.m_data[0] ||
                  (NAN(mat.m_diffuseColor.m_data[2]) || NAN(mat.m_diffuseColor.m_data[0]))))) break;
            }
            iVar2 = rand();
            mat.m_diffuseColor.m_data[0] = (double)(iVar2 % 100) / 100.0;
            iVar2 = rand();
            mat.m_diffuseColor.m_data[1] = (double)(iVar2 % 100) / 100.0;
            iVar2 = rand();
            mat.m_diffuseColor.m_data[2] = (double)(iVar2 % 100) / 100.0;
          } while( true );
        }
        TMMesh::SaveVRML2(&this->m_convexHulls[sVar3].m_mesh,&fout,&mat);
      }
    }
    else if (numCluster <
             (long)(this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) {
      TMMesh::SaveVRML2(&this->m_convexHulls[numCluster].m_mesh,&fout,&mat);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&fout);
  return (bool)cVar1;
}

Assistant:

bool HACD::Save(const char * fileName, bool uniColor, long numCluster) const
    {
        std::ofstream fout(fileName);
        if (fout.is_open())
        {
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "Saving %s\n", fileName);
                (*m_callBack)(msg, 0.0, 0.0, m_graph.GetNVertices());
            }
            Material mat;
            if (numCluster < 0)
            {
                for (size_t p = 0; p != m_nClusters; ++p) 
                {
                    if (!uniColor)
                    {
                        mat.m_diffuseColor.X() = mat.m_diffuseColor.Y() = mat.m_diffuseColor.Z() = 0.0;
                        while (mat.m_diffuseColor.X() == mat.m_diffuseColor.Y() ||
                               mat.m_diffuseColor.Z() == mat.m_diffuseColor.Y() ||
                               mat.m_diffuseColor.Z() == mat.m_diffuseColor.X()  )
                        {
                            mat.m_diffuseColor.X() = (rand()%100) / 100.0;
                            mat.m_diffuseColor.Y() = (rand()%100) / 100.0;
                            mat.m_diffuseColor.Z() = (rand()%100) / 100.0;
                        }
                    }
                    m_convexHulls[p].GetMesh().SaveVRML2(fout, mat);
                }
            }
            else if (numCluster < static_cast<long>(m_cVertices.size()))
            {
                m_convexHulls[numCluster].GetMesh().SaveVRML2(fout, mat);
            }
            fout.close();
            return true;
        }
        else
        {
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "Error saving %s\n", fileName);
                (*m_callBack)(msg, 0.0, 0.0, m_graph.GetNVertices());
            }
            return false;
        }
    }